

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::analysis::DebugInfoManager::GetParentScope
          (DebugInfoManager *this,uint32_t child_scope)

{
  bool bVar1;
  CommonDebugInfoInstructions CVar2;
  pointer ppVar3;
  uint32_t local_30;
  uint32_t parent_scope;
  CommonDebugInfoInstructions debug_opcode;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false> local_20;
  iterator dbg_scope_itr;
  uint32_t child_scope_local;
  DebugInfoManager *this_local;
  
  dbg_scope_itr.
  super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>.
  _M_cur._4_4_ = child_scope;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
       ::find(&this->id_to_dbg_inst_,
              (key_type *)
              ((long)&dbg_scope_itr.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
                      ._M_cur + 4));
  _parent_scope =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
       ::end(&this->id_to_dbg_inst_);
  bVar1 = std::__detail::operator!=
                    (&local_20,
                     (_Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
                      *)&parent_scope);
  if (bVar1) {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false,_false>
                           *)&local_20);
    CVar2 = opt::Instruction::GetCommonDebugOpcode(ppVar3->second);
    local_30 = 0;
    switch(CVar2) {
    case CommonDebugInfoDebugCompilationUnit:
      break;
    default:
      __assert_fail("false && \"Unreachable. A debug scope instruction must be \" \"DebugFunction, DebugTypeComposite, DebugLexicalBlock, \" \"or DebugCompilationUnit.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                    ,0x1fe,
                    "uint32_t spvtools::opt::analysis::DebugInfoManager::GetParentScope(uint32_t)");
    case CommonDebugInfoDebugTypeComposite:
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false,_false>
                             *)&local_20);
      local_30 = opt::Instruction::GetSingleWordOperand(ppVar3->second,9);
      break;
    case CommonDebugInfoDebugFunction:
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false,_false>
                             *)&local_20);
      local_30 = opt::Instruction::GetSingleWordOperand(ppVar3->second,9);
      break;
    case CommonDebugInfoDebugLexicalBlock:
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false,_false>
                             *)&local_20);
      local_30 = opt::Instruction::GetSingleWordOperand(ppVar3->second,7);
    }
    return local_30;
  }
  __assert_fail("dbg_scope_itr != id_to_dbg_inst_.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                ,0x1e6,
                "uint32_t spvtools::opt::analysis::DebugInfoManager::GetParentScope(uint32_t)");
}

Assistant:

uint32_t DebugInfoManager::GetParentScope(uint32_t child_scope) {
  auto dbg_scope_itr = id_to_dbg_inst_.find(child_scope);
  assert(dbg_scope_itr != id_to_dbg_inst_.end());
  CommonDebugInfoInstructions debug_opcode =
      dbg_scope_itr->second->GetCommonDebugOpcode();
  uint32_t parent_scope = kNoDebugScope;
  switch (debug_opcode) {
    case CommonDebugInfoDebugFunction:
      parent_scope = dbg_scope_itr->second->GetSingleWordOperand(
          kDebugFunctionOperandParentIndex);
      break;
    case CommonDebugInfoDebugLexicalBlock:
      parent_scope = dbg_scope_itr->second->GetSingleWordOperand(
          kDebugLexicalBlockOperandParentIndex);
      break;
    case CommonDebugInfoDebugTypeComposite:
      parent_scope = dbg_scope_itr->second->GetSingleWordOperand(
          kDebugTypeCompositeOperandParentIndex);
      break;
    case CommonDebugInfoDebugCompilationUnit:
      // DebugCompilationUnit does not have a parent scope.
      break;
    default:
      assert(false &&
             "Unreachable. A debug scope instruction must be "
             "DebugFunction, DebugTypeComposite, DebugLexicalBlock, "
             "or DebugCompilationUnit.");
      break;
  }
  return parent_scope;
}